

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O0

int64_t get_time_t_min(void)

{
  time_t a;
  
  if (get_time_t_min::computed == 0) {
    for (a = -1; a < get_time_t_min::t; a = a << 1) {
      get_time_t_min::t = a;
    }
    get_time_t_min::computed = 1;
  }
  return get_time_t_min::t;
}

Assistant:

static int64_t
get_time_t_min(void)
{
#if defined(TIME_T_MIN)
	return TIME_T_MIN;
#else
	/* 't' will hold the minimum value, which will be zero (if
	 * time_t is unsigned) or -2^n (if time_t is signed). */
	static int computed;
	static time_t t;
	time_t a;
	if (computed == 0) {
		a = (time_t)-1;
		while (a < t) {
			t = a;
			a = a * 2;
		}			
		computed = 1;
	}
	return t;
#endif
}